

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_main.c
# Opt level: O0

void parse_early_commandline(int argc,char **argv)

{
  undefined1 local_20 [4];
  int local_1c;
  int opt_idx;
  int opt;
  char **argv_local;
  int argc_local;
  
  _opterr = 0;
  _opt_idx = argv;
  argv_local._4_4_ = argc;
  while (local_1c = getopt_long(argv_local._4_4_,_opt_idx,"-",oonf_options,local_20), -1 < local_1c)
  {
    if (local_1c == 0x101) {
      _debug_early = true;
    }
    else if (local_1c == 0x102) {
      _ignore_unknown = true;
    }
  }
  return;
}

Assistant:

static void
parse_early_commandline(int argc, char **argv) {
  int opt, opt_idx;

  opterr = 0;
  while (0 <= (opt = getopt_long(argc, argv, "-", oonf_options, &opt_idx))) {
    switch (opt) {
      case argv_option_debug_early:
        _debug_early = true;
        break;
      case argv_option_ignore_unknown:
        _ignore_unknown = true;
        break;
      default:
        break;
    }
  }
}